

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AlterEntry
          (DuckTableEntry *this,CatalogTransaction transaction,AlterInfo *info)

{
  ClientContext *pCVar1;
  long in_RDX;
  
  if (transaction.context.ptr == (ClientContext *)0x0) {
    if (((*(char *)(in_RDX + 9) == '\x01') && (*(char *)(in_RDX + 0x71) == '\a')) &&
       (*(char *)(in_RDX + 0xf8) == '\0')) {
      AddForeignKeyConstraint
                (this,(optional_ptr<duckdb::ClientContext,_true>)info,(AlterForeignKeyInfo *)0x0);
    }
    else {
      CatalogEntry::AlterEntry((CatalogEntry *)this,transaction,info);
    }
  }
  else {
    pCVar1 = CatalogTransaction::GetContext(&transaction);
    (*(info->super_ParseInfo)._vptr_ParseInfo[2])(this,info,pCVar1);
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AlterEntry(CatalogTransaction transaction, AlterInfo &info) {
	if (transaction.HasContext()) {
		return AlterEntry(transaction.GetContext(), info);
	}
	if (info.type != AlterType::ALTER_TABLE) {
		return CatalogEntry::AlterEntry(transaction, info);
	}

	auto &table_info = info.Cast<AlterTableInfo>();
	if (table_info.alter_table_type != AlterTableType::FOREIGN_KEY_CONSTRAINT) {
		return CatalogEntry::AlterEntry(transaction, info);
	}

	auto &foreign_key_constraint_info = table_info.Cast<AlterForeignKeyInfo>();
	if (foreign_key_constraint_info.type != AlterForeignKeyType::AFT_ADD) {
		return CatalogEntry::AlterEntry(transaction, info);
	}

	// We add foreign key constraints without a client context during checkpoint loading.
	return AddForeignKeyConstraint(nullptr, foreign_key_constraint_info);
}